

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->NavWindow;
  window = pIVar1;
  if (layer == ImGuiNavLayer_Main) {
    window = pIVar1->NavLastChildNavWindow;
    if ((window == (ImGuiWindow *)0x0) || (window->WasActive == false)) {
      window = pIVar1;
    }
    GImGui->NavWindow = window;
  }
  if (window->NavLastIds[layer] != 0) {
    SetNavID(window->NavLastIds[layer],layer,0,window->NavRectRel + layer);
    pIVar2->NavMousePosDirty = true;
    pIVar2->NavDisableHighlight = false;
    pIVar2->NavDisableMouseHover = true;
    return;
  }
  pIVar2->NavLayer = layer;
  NavInitWindow(window,true);
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = g.NavMousePosDirty = true;
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}